

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

boolean tele_jump_ok(level *lev,int x1,int y1,int x2,int y2)

{
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  level *lev_local;
  
  if ('\0' < (lev->dndest).nlx) {
    if (((((lev->dndest).nlx <= x1) && (x1 <= (lev->dndest).nhx)) && ((lev->dndest).nly <= y1)) &&
       ((y1 <= (lev->dndest).nhy &&
        (((x2 < (lev->dndest).nlx || ((lev->dndest).nhx < x2)) ||
         ((y2 < (lev->dndest).nly || ((lev->dndest).nhy < y2)))))))) {
      return '\0';
    }
    if ((((x1 < (lev->dndest).nlx) || ((lev->dndest).nhx < x1)) ||
        ((y1 < (lev->dndest).nly || ((lev->dndest).nhy < y1)))) &&
       (((((lev->dndest).nlx <= x2 && (x2 <= (lev->dndest).nhx)) && ((lev->dndest).nly <= y2)) &&
        (y2 <= (lev->dndest).nhy)))) {
      return '\0';
    }
  }
  if ('\0' < (lev->updest).nlx) {
    if (((((lev->updest).nlx <= x1) && (x1 <= (lev->updest).nhx)) &&
        (((lev->updest).nly <= y1 && (y1 <= (lev->updest).nhy)))) &&
       (((x2 < (lev->updest).nlx || ((lev->updest).nhx < x2)) ||
        ((y2 < (lev->updest).nly || ((lev->updest).nhy < y2)))))) {
      return '\0';
    }
    if (((((x1 < (lev->updest).nlx) || ((lev->updest).nhx < x1)) || (y1 < (lev->updest).nly)) ||
        ((lev->updest).nhy < y1)) &&
       ((((lev->updest).nlx <= x2 && (x2 <= (lev->updest).nhx)) &&
        (((lev->updest).nly <= y2 && (y2 <= (lev->updest).nhy)))))) {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

static boolean tele_jump_ok(const struct level *lev, int x1, int y1, int x2, int y2)
{
	if (lev->dndest.nlx > 0) {
	    /* if inside a restricted region, can't teleport outside */
	    if (within_bounded_area(x1, y1, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy) &&
		!within_bounded_area(x2, y2, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy))
		return FALSE;
	    /* and if outside, can't teleport inside */
	    if (!within_bounded_area(x1, y1, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy) &&
		within_bounded_area(x2, y2, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy))
		return FALSE;
	}
	if (lev->updest.nlx > 0) {		/* ditto */
	    if (within_bounded_area(x1, y1, lev->updest.nlx, lev->updest.nly,
						lev->updest.nhx, lev->updest.nhy) &&
		!within_bounded_area(x2, y2, lev->updest.nlx, lev->updest.nly,
						lev->updest.nhx, lev->updest.nhy))
		return FALSE;
	    if (!within_bounded_area(x1, y1, lev->updest.nlx, lev->updest.nly,
						lev->updest.nhx, lev->updest.nhy) &&
		within_bounded_area(x2, y2, lev->updest.nlx, lev->updest.nly,
						lev->updest.nhx, lev->updest.nhy))
		return FALSE;
	}
	return TRUE;
}